

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void WriteVars(FILE *file,SDWORD *vars,size_t count,DWORD id)

{
  DWORD local_33c;
  undefined1 local_338 [4];
  DWORD var;
  FPNGChunkArchive arc;
  size_t j;
  size_t i;
  DWORD id_local;
  size_t count_local;
  SDWORD *vars_local;
  FILE *file_local;
  
  for (j = 0; (j < count && (vars[j] == 0)); j = j + 1) {
  }
  if (j < count) {
    for (arc.Chunk._48_8_ = count - 1;
        (j < (ulong)arc.Chunk._48_8_ && (vars[arc.Chunk._48_8_] == 0));
        arc.Chunk._48_8_ = arc.Chunk._48_8_ + -1) {
    }
    FPNGChunkArchive::FPNGChunkArchive((FPNGChunkArchive *)local_338,file,id);
    for (j = 0; j <= (ulong)arc.Chunk._48_8_; j = j + 1) {
      local_33c = vars[j];
      FArchive::operator<<((FArchive *)local_338,&local_33c);
    }
    FPNGChunkArchive::~FPNGChunkArchive((FPNGChunkArchive *)local_338);
  }
  return;
}

Assistant:

static void WriteVars (FILE *file, SDWORD *vars, size_t count, DWORD id)
{
	size_t i, j;

	for (i = 0; i < count; ++i)
	{
		if (vars[i] != 0)
			break;
	}
	if (i < count)
	{
		// Find last non-zero var. Anything beyond the last stored variable
		// will be zeroed at load time.
		for (j = count-1; j > i; --j)
		{
			if (vars[j] != 0)
				break;
		}
		FPNGChunkArchive arc (file, id);
		for (i = 0; i <= j; ++i)
		{
			DWORD var = vars[i];
			arc << var;
		}
	}
}